

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O0

void __thiscall arma::Mat<double>::Mat(Mat<double> *this,Mat<double> *X)

{
  unsigned_short uVar1;
  double *pdVar2;
  unsigned_short *puVar3;
  double **ppdVar4;
  uint *puVar5;
  uint *in_RSI;
  uint *in_RDI;
  Mat<double> *in_stack_fffffffffffffff0;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  in_RDI[2] = in_RSI[2];
  in_RDI[3] = in_RSI[3];
  *(undefined2 *)(in_RDI + 4) = 0;
  *(undefined2 *)((long)in_RDI + 0x12) = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  if (((in_RSI[3] < 0x11) && (*(short *)((long)in_RSI + 0x12) != 1)) &&
     (*(short *)((long)in_RSI + 0x12) != 2)) {
    init_cold(in_stack_fffffffffffffff0);
    if ((*(void **)(in_RDI + 8) != *(void **)(in_RSI + 8)) && (in_RSI[2] != 0)) {
      memcpy(*(void **)(in_RDI + 8),*(void **)(in_RSI + 8),(ulong)in_RSI[2] << 3);
    }
    if ((*(short *)((long)in_RSI + 0x12) == 0) && (in_RSI[3] < 0x11)) {
      puVar5 = access::rw<unsigned_int>(in_RSI);
      *puVar5 = 0;
      puVar5 = access::rw<unsigned_int>(in_RSI + 1);
      *puVar5 = 0;
      puVar5 = access::rw<unsigned_int>(in_RSI + 2);
      *puVar5 = 0;
      ppdVar4 = access::rw<double_const*>((double **)(in_RSI + 8));
      *ppdVar4 = (double *)0x0;
    }
  }
  else {
    uVar1 = *(unsigned_short *)((long)in_RSI + 0x12);
    puVar3 = access::rw<unsigned_short>((unsigned_short *)((long)in_RDI + 0x12));
    *puVar3 = uVar1;
    pdVar2 = *(double **)(in_RSI + 8);
    ppdVar4 = access::rw<double_const*>((double **)(in_RDI + 8));
    *ppdVar4 = pdVar2;
    puVar5 = access::rw<unsigned_int>(in_RSI);
    *puVar5 = 0;
    puVar5 = access::rw<unsigned_int>(in_RSI + 1);
    *puVar5 = 0;
    puVar5 = access::rw<unsigned_int>(in_RSI + 2);
    *puVar5 = 0;
    puVar5 = access::rw<unsigned_int>(in_RSI + 3);
    *puVar5 = 0;
    puVar3 = access::rw<unsigned_short>((unsigned_short *)((long)in_RSI + 0x12));
    *puVar3 = 0;
    ppdVar4 = access::rw<double_const*>((double **)(in_RSI + 8));
    *ppdVar4 = (double *)0x0;
  }
  return;
}

Assistant:

inline
Mat<eT>::Mat(Mat<eT>&& X)
  : n_rows   (X.n_rows )
  , n_cols   (X.n_cols )
  , n_elem   (X.n_elem )
  , n_alloc  (X.n_alloc)
  , vec_state(0        )
  , mem_state(0        )
  , mem      (         )
  {
  arma_debug_sigprint(arma_str::format("this: %x; X: %x") % this % &X);
  
  if( (X.n_alloc > arma_config::mat_prealloc) || (X.mem_state == 1) || (X.mem_state == 2) )
    {
    access::rw(mem_state) = X.mem_state;
    access::rw(mem)       = X.mem;
    
    access::rw(X.n_rows)    = 0;
    access::rw(X.n_cols)    = 0;
    access::rw(X.n_elem)    = 0;
    access::rw(X.n_alloc)   = 0;
    access::rw(X.mem_state) = 0;
    access::rw(X.mem)       = nullptr;
    }
  else  // condition: (X.n_alloc <= arma_config::mat_prealloc) || (X.mem_state == 0) || (X.mem_state == 3)
    {
    init_cold();
    
    arrayops::copy( memptr(), X.mem, X.n_elem );
    
    if( (X.mem_state == 0) && (X.n_alloc <= arma_config::mat_prealloc) )
      {
      access::rw(X.n_rows) = 0;
      access::rw(X.n_cols) = 0;
      access::rw(X.n_elem) = 0;
      access::rw(X.mem)    = nullptr;
      }
    }
  }